

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O2

void Mvc_CoverDivide(Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  iVar2 = Mvc_CoverReadCubeNum(pDiv);
  if (iVar2 <= iVar1) {
    iVar1 = Mvc_CoverCheckSuppContainment(pCover,pDiv);
    if (iVar1 != 0) {
      Mvc_CoverDivideInternal(pCover,pDiv,ppQuo,ppRem);
      return;
    }
  }
  *ppQuo = (Mvc_Cover_t *)0x0;
  *ppRem = (Mvc_Cover_t *)0x0;
  return;
}

Assistant:

void Mvc_CoverDivide( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    // check the number of cubes
    if ( Mvc_CoverReadCubeNum( pCover ) < Mvc_CoverReadCubeNum( pDiv ) )
    {
        *ppQuo = NULL;
        *ppRem = NULL;
        return;
    }

    // make sure that support of pCover contains that of pDiv
    if ( !Mvc_CoverCheckSuppContainment( pCover, pDiv ) )
    {
        *ppQuo = NULL;
        *ppRem = NULL;
        return;
    }

    // perform the general division
    Mvc_CoverDivideInternal( pCover, pDiv, ppQuo, ppRem );
}